

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Qualifier.cpp
# Opt level: O3

void __thiscall Refal2::CQualifier::printChars(CQualifier *this,ostream *outputStream)

{
  CFastSet<char> *this_00;
  _Rb_tree_node_base *p_Var1;
  pointer pcVar2;
  CQualifier *pCVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  _Rb_tree_node_base *p_Var7;
  bool bVar8;
  size_t __result;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  int i;
  string *psVar12;
  size_t __position;
  set<char,_std::less<char>,_std::allocator<char>_> a;
  allocator local_b9;
  undefined1 local_b8 [12];
  uint uStack_ac;
  char local_a8 [24];
  undefined1 local_90 [32];
  _Rb_tree_node_base *local_70;
  size_t local_68;
  CQualifier *local_60;
  CAnsiSet local_58;
  CAnsiSet local_48;
  
  local_58.super__Base_bitset<2UL>._M_w[0]._0_4_ =
       (uint)(this->ansichars).super__Base_bitset<2UL>._M_w[0];
  local_58.super__Base_bitset<2UL>._M_w[0]._4_4_ =
       *(uint *)((long)(this->ansichars).super__Base_bitset<2UL>._M_w + 4);
  local_58.super__Base_bitset<2UL>._M_w[1]._0_4_ =
       (uint)(this->ansichars).super__Base_bitset<2UL>._M_w[1];
  local_58.super__Base_bitset<2UL>._M_w[1]._4_4_ =
       *(uint *)((long)(this->ansichars).super__Base_bitset<2UL>._M_w + 0xc);
  local_48.super__Base_bitset<2UL>._M_w[0]._0_4_ =
       (uint)CQualifierBuilder::AnsiL & (uint)local_58.super__Base_bitset<2UL>._M_w[0];
  local_48.super__Base_bitset<2UL>._M_w[0]._4_4_ =
       CQualifierBuilder::AnsiL._4_4_ & local_58.super__Base_bitset<2UL>._M_w[0]._4_4_;
  local_48.super__Base_bitset<2UL>._M_w[1]._0_4_ =
       (uint)DAT_001492f8 & (uint)local_58.super__Base_bitset<2UL>._M_w[1];
  local_48.super__Base_bitset<2UL>._M_w[1]._4_4_ =
       DAT_001492f8._4_4_ & local_58.super__Base_bitset<2UL>._M_w[1]._4_4_;
  local_58.super__Base_bitset<2UL>._M_w[0]._0_4_ =
       (uint)CQualifierBuilder::AnsiD & (uint)local_58.super__Base_bitset<2UL>._M_w[0];
  local_58.super__Base_bitset<2UL>._M_w[0]._4_4_ =
       CQualifierBuilder::AnsiD._4_4_ & local_58.super__Base_bitset<2UL>._M_w[0]._4_4_;
  local_58.super__Base_bitset<2UL>._M_w[1]._0_4_ =
       (uint)DAT_00149308 & (uint)local_58.super__Base_bitset<2UL>._M_w[1];
  local_58.super__Base_bitset<2UL>._M_w[1]._4_4_ =
       DAT_00149308._4_4_ & local_58.super__Base_bitset<2UL>._M_w[1]._4_4_;
  std::__cxx11::string::string((string *)local_90,CQualifierBuilder::Alphabet,&local_b9);
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"L","");
  printAnsiSet(outputStream,&local_48,(string *)local_90,(string *)local_b8);
  if ((char *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_);
  }
  if ((undefined1 *)CONCAT71(local_90._1_7_,local_90[0]) != local_90 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_90._1_7_,local_90[0]));
  }
  std::__cxx11::string::string((string *)local_90,CQualifierBuilder::Numbers,&local_b9);
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"D","");
  printAnsiSet(outputStream,&local_58,(string *)local_90,(string *)local_b8);
  if ((char *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_);
  }
  if ((undefined1 *)CONCAT71(local_90._1_7_,local_90[0]) != local_90 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_90._1_7_,local_90[0]));
  }
  local_b8._0_4_ =
       ~((uint)local_58.super__Base_bitset<2UL>._M_w[0] |
        (uint)local_48.super__Base_bitset<2UL>._M_w[0]) &
       (uint)(this->ansichars).super__Base_bitset<2UL>._M_w[0];
  local_b8._4_4_ =
       ~(local_58.super__Base_bitset<2UL>._M_w[0]._4_4_ |
        local_48.super__Base_bitset<2UL>._M_w[0]._4_4_) &
       *(uint *)((long)(this->ansichars).super__Base_bitset<2UL>._M_w + 4);
  local_b8._8_4_ =
       ~((uint)local_58.super__Base_bitset<2UL>._M_w[1] |
        (uint)local_48.super__Base_bitset<2UL>._M_w[1]) &
       (uint)(this->ansichars).super__Base_bitset<2UL>._M_w[1];
  uStack_ac = ~(local_58.super__Base_bitset<2UL>._M_w[1]._4_4_ |
               local_48.super__Base_bitset<2UL>._M_w[1]._4_4_) &
              *(uint *)((long)(this->ansichars).super__Base_bitset<2UL>._M_w + 0xc);
  uVar9 = 0;
  psVar12 = (string *)local_b8;
  bVar4 = true;
  do {
    bVar8 = bVar4;
    pcVar2 = (psVar12->_M_dataplus)._M_p;
    uVar11 = (long)pcVar2 - ((ulong)pcVar2 >> 1 & 0x5555555555555555);
    uVar11 = (uVar11 >> 2 & 0x3333333333333333) + (uVar11 & 0x3333333333333333);
    uVar9 = uVar9 + (((uVar11 >> 4) + uVar11 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    psVar12 = (string *)(local_b8 + 8);
    bVar4 = false;
  } while (bVar8);
  local_60 = this;
  if (0x1e < uVar9) {
    local_b8._8_4_ = (uint)DAT_00149308 | (uint)DAT_001492f8 | local_b8._8_4_;
    uStack_ac = DAT_00149308._4_4_ | DAT_001492f8._4_4_ | uStack_ac;
    local_b8._4_4_ =
         CQualifierBuilder::AnsiD._4_4_ | CQualifierBuilder::AnsiL._4_4_ | local_b8._4_4_;
    local_b8._0_4_ =
         (uint)CQualifierBuilder::AnsiD | (uint)CQualifierBuilder::AnsiL | local_b8._0_4_;
    std::__ostream_insert<char,std::char_traits<char>>(outputStream,"(",1);
  }
  __position = 1;
  std::__ostream_insert<char,std::char_traits<char>>(outputStream,"\'",1);
  do {
    bVar4 = std::bitset<128UL>::test((bitset<128UL> *)local_b8,__position);
    if (bVar4 == uVar9 < 0x1f) {
      local_90[0] = SUB81(__position,0);
      std::__ostream_insert<char,std::char_traits<char>>(outputStream,local_90,1);
    }
    __position = __position + 1;
  } while (__position != 0x80);
  std::__ostream_insert<char,std::char_traits<char>>(outputStream,"\' ",2);
  if (0x1e < uVar9) {
    std::__ostream_insert<char,std::char_traits<char>>(outputStream,")",1);
  }
  pCVar3 = local_60;
  this_00 = &local_60->chars;
  iVar5 = (local_60->chars).elementsSize;
  if (iVar5 != 0 && (local_60->flags & 2) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(outputStream,"(",1);
    iVar5 = this_00->elementsSize;
  }
  if (iVar5 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(outputStream,"\'",1);
  }
  p_Var1 = (_Rb_tree_node_base *)(local_90 + 8);
  local_90._8_4_ = _S_red;
  local_90._16_8_ = 0;
  local_68 = 0;
  local_90._24_8_ = p_Var1;
  local_70 = p_Var1;
  CFastSet<char>::GetSet(this_00,(CSet *)local_90);
  if ((_Rb_tree_node_base *)local_90._24_8_ != p_Var1) {
    p_Var7 = (_Rb_tree_node_base *)local_90._24_8_;
    do {
      local_b9 = *(allocator *)&p_Var7[1]._M_color;
      std::__ostream_insert<char,std::char_traits<char>>(outputStream,(char *)&local_b9,1);
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != p_Var1);
  }
  if (this_00->elementsSize != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(outputStream,"\'",1);
    uVar6 = pCVar3->flags;
    if (((uVar6 & 2) == 0) || ((pCVar3->chars).elementsSize == 0)) goto LAB_0012a865;
    std::__ostream_insert<char,std::char_traits<char>>(outputStream,") ",2);
  }
  uVar6 = pCVar3->flags;
LAB_0012a865:
  bVar4 = (uVar6 & 2) == 0;
  pcVar10 = "O ";
  if (bVar4) {
    pcVar10 = "(O) ";
  }
  std::__ostream_insert<char,std::char_traits<char>>(outputStream,pcVar10,(ulong)bVar4 * 2 + 2);
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            ((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> *)
             local_90);
  return;
}

Assistant:

void CQualifier::printChars( std::ostream& outputStream ) const
{
	CAnsiSet L = ansichars & CQualifierBuilder::AnsiL;
	CAnsiSet D = ansichars & CQualifierBuilder::AnsiD;

	printAnsiSet( outputStream, L, CQualifierBuilder::Alphabet, "L" );
	printAnsiSet( outputStream, D, CQualifierBuilder::Numbers, "D" );

	CAnsiSet other = ansichars & ~(L | D);
	bool superFlag = other.count() < 31;
	if( !superFlag ) {
		other |= CQualifierBuilder::AnsiL | CQualifierBuilder::AnsiD;
		outputStream << "(";
	}
	outputStream << "'";
	for( int i = 1; i < AnsiSetSize; i++ ) {
		if( other.test( i ) == superFlag ) {
			outputStream << static_cast<char>( i );
		}
	}
	outputStream << "' ";
	if( !superFlag ) {
		outputStream << ")";
	}

	if( IsIncludeAllChars() && !chars.IsEmpty() ) {
		outputStream << "(";
	}
	if( !chars.IsEmpty() ) {
		outputStream << "'";
	}
	std::set<TChar> a;
	chars.GetSet( &a );
	for( std::set<TChar>::const_iterator i = a.begin(); i != a.end(); ++i ) {
		outputStream << *i;
	}
	if( !chars.IsEmpty() ) {
		outputStream << "'";
	}
	if( IsIncludeAllChars() && !chars.IsEmpty() ) {
		outputStream << ") ";
	}

	if( IsIncludeAllChars() ) {
		outputStream << "O ";
	} else {
		outputStream << "(O) ";
	}
}